

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * keyword2str(yang_token keyword)

{
  char *pcStack_10;
  yang_token keyword_local;
  
  switch(keyword) {
  case YANG_ANYXML:
    pcStack_10 = "anyxml";
    break;
  case YANG_ARGUMENT:
    pcStack_10 = "argument";
    break;
  case YANG_AUGMENT:
    pcStack_10 = "augment";
    break;
  case YANG_BASE:
    pcStack_10 = "base";
    break;
  case YANG_BELONGS_TO:
    pcStack_10 = "belongs-to";
    break;
  case YANG_BIT:
    pcStack_10 = "bit";
    break;
  case YANG_CASE:
    pcStack_10 = "case";
    break;
  case YANG_CHOICE:
    pcStack_10 = "choice";
    break;
  case YANG_CONFIG:
    pcStack_10 = "config";
    break;
  case YANG_CONTACT:
    pcStack_10 = "contact";
    break;
  case YANG_CONTAINER:
    pcStack_10 = "container";
    break;
  case YANG_DEFAULT:
    pcStack_10 = "default";
    break;
  case YANG_DESCRIPTION:
    pcStack_10 = "description";
    break;
  case YANG_DEVIATE:
    pcStack_10 = "deviate";
    break;
  case YANG_DEVIATION:
    pcStack_10 = "deviation";
    break;
  case YANG_ENUM:
    pcStack_10 = "enum";
    break;
  case YANG_ERROR_APP_TAG:
    pcStack_10 = "error-app-tag";
    break;
  case YANG_ERROR_MESSAGE:
    pcStack_10 = "error-message";
    break;
  case YANG_EXTENSION:
    pcStack_10 = "extension";
    break;
  case YANG_FEATURE:
    pcStack_10 = "feature";
    break;
  case YANG_FRACTION_DIGITS:
    pcStack_10 = "fraction-digits";
    break;
  case YANG_GROUPING:
    pcStack_10 = "grouping";
    break;
  case YANG_IDENTITY:
    pcStack_10 = "identitiy";
    break;
  case YANG_IF_FEATURE:
    pcStack_10 = "if-feature";
    break;
  case YANG_IMPORT:
    pcStack_10 = "import";
    break;
  case YANG_INCLUDE:
    pcStack_10 = "include";
    break;
  case YANG_INPUT:
    pcStack_10 = "input";
    break;
  case YANG_KEY:
    pcStack_10 = "key";
    break;
  case YANG_LEAF:
    pcStack_10 = "leaf";
    break;
  case YANG_LEAF_LIST:
    pcStack_10 = "leaf-list";
    break;
  case YANG_LENGTH:
    pcStack_10 = "length";
    break;
  case YANG_LIST:
    pcStack_10 = "list";
    break;
  case YANG_MANDATORY:
    pcStack_10 = "mandatory";
    break;
  case YANG_MAX_ELEMENTS:
    pcStack_10 = "max-elements";
    break;
  case YANG_MIN_ELEMENTS:
    pcStack_10 = "min-elements";
    break;
  case YANG_MODULE:
    pcStack_10 = "module";
    break;
  case YANG_MUST:
    pcStack_10 = "must";
    break;
  case YANG_NAMESPACE:
    pcStack_10 = "namespace";
    break;
  case YANG_NOTIFICATION:
    pcStack_10 = "notification";
    break;
  case YANG_ORDERED_BY:
    pcStack_10 = "ordered-by";
    break;
  case YANG_ORGANIZATION:
    pcStack_10 = "organization";
    break;
  case YANG_OUTPUT:
    pcStack_10 = "output";
    break;
  case YANG_PATH:
    pcStack_10 = "path";
    break;
  case YANG_PATTERN:
    pcStack_10 = "pattern";
    break;
  case YANG_POSITION:
    pcStack_10 = "position";
    break;
  case YANG_PREFIX:
    pcStack_10 = "prefix";
    break;
  case YANG_PRESENCE:
    pcStack_10 = "presence";
    break;
  case YANG_RANGE:
    pcStack_10 = "range";
    break;
  case YANG_REFERENCE:
    pcStack_10 = "reference";
    break;
  case YANG_REFINE:
    pcStack_10 = "refine";
    break;
  case YANG_REQUIRE_INSTANCE:
    pcStack_10 = "require-instance";
    break;
  case YANG_REVISION:
    pcStack_10 = "revision";
    break;
  case YANG_REVISION_DATE:
    pcStack_10 = "revision-date";
    break;
  case YANG_RPC:
    pcStack_10 = "rpc";
    break;
  case YANG_STATUS:
    pcStack_10 = "status";
    break;
  case YANG_SUBMODULE:
    pcStack_10 = "submodule";
    break;
  case YANG_TYPE:
    pcStack_10 = "type";
    break;
  case YANG_TYPEDEF:
    pcStack_10 = "typedef";
    break;
  case YANG_UNIQUE:
    pcStack_10 = "unique";
    break;
  case YANG_UNITS:
    pcStack_10 = "units";
    break;
  case YANG_USES:
    pcStack_10 = "uses";
    break;
  case YANG_VALUE:
    pcStack_10 = "value";
    break;
  case YANG_WHEN:
    pcStack_10 = "when";
    break;
  case YANG_YANG_VERSION:
    pcStack_10 = "yang-version";
    break;
  case YANG_YIN_ELEMENT:
    pcStack_10 = "yin-element";
    break;
  case YANG_SEMICOLON:
    pcStack_10 = ";";
    break;
  case YANG_LEFT_BRACE:
    pcStack_10 = "{";
    break;
  case YANG_RIGHT_BRACE:
    pcStack_10 = "}";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static const char *
keyword2str(enum yang_token keyword)
{
    switch (keyword) {
    case YANG_ANYXML:
        return "anyxml";
    case YANG_ARGUMENT:
        return "argument";
    case YANG_AUGMENT:
        return "augment";
    case YANG_BASE:
        return "base";
    case YANG_BELONGS_TO:
        return "belongs-to";
    case YANG_BIT:
        return "bit";
    case YANG_CASE:
        return "case";
    case YANG_CHOICE:
        return "choice";
    case YANG_CONFIG:
        return "config";
    case YANG_CONTACT:
        return "contact";
    case YANG_CONTAINER:
        return "container";
    case YANG_DEFAULT:
        return "default";
    case YANG_DESCRIPTION:
        return "description";
    case YANG_DEVIATE:
        return "deviate";
    case YANG_DEVIATION:
        return "deviation";
    case YANG_ENUM:
        return "enum";
    case YANG_ERROR_APP_TAG:
        return "error-app-tag";
    case YANG_ERROR_MESSAGE:
        return "error-message";
    case YANG_EXTENSION:
        return "extension";
    case YANG_FEATURE:
        return "feature";
    case YANG_FRACTION_DIGITS:
        return "fraction-digits";
    case YANG_GROUPING:
        return "grouping";
    case YANG_IDENTITY:
        return "identitiy";
    case YANG_IF_FEATURE:
        return "if-feature";
    case YANG_IMPORT:
        return "import";
    case YANG_INCLUDE:
        return "include";
    case YANG_INPUT:
        return "input";
    case YANG_KEY:
        return "key";
    case YANG_LEAF:
        return "leaf";
    case YANG_LEAF_LIST:
        return "leaf-list";
    case YANG_LENGTH:
        return "length";
    case YANG_LIST:
        return "list";
    case YANG_MANDATORY:
        return "mandatory";
    case YANG_MAX_ELEMENTS:
        return "max-elements";
    case YANG_MIN_ELEMENTS:
        return "min-elements";
    case YANG_MODULE:
        return "module";
    case YANG_MUST:
        return "must";
    case YANG_NAMESPACE:
        return "namespace";
    case YANG_NOTIFICATION:
        return "notification";
    case YANG_ORDERED_BY:
        return "ordered-by";
    case YANG_ORGANIZATION:
        return "organization";
    case YANG_OUTPUT:
        return "output";
    case YANG_PATH:
        return "path";
    case YANG_PATTERN:
        return "pattern";
    case YANG_POSITION:
        return "position";
    case YANG_PREFIX:
        return "prefix";
    case YANG_PRESENCE:
        return "presence";
    case YANG_RANGE:
        return "range";
    case YANG_REFERENCE:
        return "reference";
    case YANG_REFINE:
        return "refine";
    case YANG_REQUIRE_INSTANCE:
        return "require-instance";
    case YANG_REVISION:
        return "revision";
    case YANG_REVISION_DATE:
        return "revision-date";
    case YANG_RPC:
        return "rpc";
    case YANG_STATUS:
        return "status";
    case YANG_SUBMODULE:
        return "submodule";
    case YANG_TYPE:
        return "type";
    case YANG_TYPEDEF:
        return "typedef";
    case YANG_UNIQUE:
        return "unique";
    case YANG_UNITS:
        return "units";
    case YANG_USES:
        return "uses";
    case YANG_VALUE:
        return "value";
    case YANG_WHEN:
        return "when";
    case YANG_YANG_VERSION:
        return "yang-version";
    case YANG_YIN_ELEMENT:
        return "yin-element";
    case YANG_SEMICOLON:
        return ";";
    case YANG_LEFT_BRACE:
        return "{";
    case YANG_RIGHT_BRACE:
        return "}";
    default:
        return "";
    }
}